

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

bool __thiscall Parser::match(Parser *this,string *token)

{
  __type_conflict _Var1;
  size_type __n;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *token_local;
  Parser *this_local;
  
  local_20 = token;
  token_local = &this->expr;
  skip_whitespace(this);
  sVar2 = this->pos;
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                  (local_20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_40,&this->expr,sVar2,__n);
  _Var1 = std::operator==(&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  if (_Var1) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (local_20);
    this->pos = sVar2 + this->pos;
    skip_whitespace(this);
  }
  return _Var1;
}

Assistant:

bool match( const std::string & token )
  {
    skip_whitespace();
    if ( expr.substr( pos, token.length() ) == token )
    {
      pos += token.length();
      skip_whitespace();
      return true;
    }
    return false;
  }